

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O0

err_t bignKeypairGen(octet *privkey,octet *pubkey,bign_params *params,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  gen_i rng_00;
  gen_i p_Var2;
  gen_i dest;
  bign_deep_i in_RCX;
  word *in_RDX;
  ec_o *in_RSI;
  word *in_RDI;
  void *in_R8;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  size_t in_stack_ffffffffffffff88;
  bign_params *in_stack_ffffffffffffff90;
  gen_i n_00;
  word *mod;
  bign_params *in_stack_ffffffffffffffc0;
  word *a;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  bVar1 = memIsValid(in_RDX,0x150);
  if (bVar1 == 0) {
    eVar3 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffff90);
    if (bVar1 == 0) {
      eVar3 = 0x1f6;
    }
    else if (in_RCX == (bign_deep_i)0x0) {
      eVar3 = 0x130;
    }
    else {
      bignStart_keep((size_t)in_RDX,in_RCX);
      rng_00 = (gen_i)blobCreate(in_stack_ffffffffffffff88);
      if (rng_00 == (gen_i)0x0) {
        eVar3 = 0x6e;
      }
      else {
        eVar3 = bignStart((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0);
        if (eVar3 == 0) {
          a = *(word **)(*(long *)(rng_00 + 0x18) + 0x38);
          mod = *(word **)(*(long *)(rng_00 + 0x18) + 0x30);
          n_00 = rng_00;
          bVar1 = memIsValid(in_RDI,(size_t)a);
          if ((bVar1 != 0) && (bVar1 = memIsValid(in_RSI,(long)a << 1), bVar1 != 0)) {
            p_Var2 = rng_00 + *(long *)rng_00 + (long)mod * 8;
            dest = p_Var2 + (long)mod * 0x10;
            bVar1 = zzRandNZMod(a,mod,(size_t)n_00,rng_00,rng_00 + *(long *)rng_00);
            if (bVar1 == 0) {
              blobClose((blob_t)0x16031c);
              return 0x130;
            }
            bVar1 = ecMulA((word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,in_RSI,in_RDX,(size_t)in_RCX,in_R8);
            if (bVar1 == 0) {
              eVar3 = 0x1f6;
            }
            else {
              u64To(dest,in_stack_ffffffffffffff88,(u64 *)0x160369);
              (**(code **)(*(long *)(rng_00 + 0x18) + 0x48))
                        (in_RSI,p_Var2,*(undefined8 *)(rng_00 + 0x18),dest);
              (**(code **)(*(long *)(rng_00 + 0x18) + 0x48))
                        ((long)&(in_RSI->hdr).keep + (long)a,p_Var2 + (long)mod * 8,
                         *(undefined8 *)(rng_00 + 0x18),dest);
            }
            blobClose((blob_t)0x1603dc);
            return eVar3;
          }
          blobClose((blob_t)0x160299);
          eVar3 = 0x6d;
        }
        else {
          blobClose((blob_t)0x160229);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bignKeypairGen(octet privkey[], octet pubkey[],
	const bign_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeypairGen_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, no) || !memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <-R {1,2,..., q - 1}
	if (!zzRandNZMod(d, ec->f->mod, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить ключи
		wwTo(privkey, no, d);
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + no, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}